

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

void __thiscall
AlternativeLoader::AlternativeLoader(AlternativeLoader *this,AlternativeLoader *toCopy)

{
  string *this_00;
  AlternativeLoader *toCopy_local;
  AlternativeLoader *this_local;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00);
  this->pDominationMapFile = this_00;
  std::__cxx11::string::operator=
            ((string *)this->pDominationMapFile,(string *)toCopy->pDominationMapFile);
  return;
}

Assistant:

AlternativeLoader::AlternativeLoader(const AlternativeLoader &toCopy) {
    pDominationMapFile = new std::string();
    *pDominationMapFile = *toCopy.pDominationMapFile;
}